

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
winmd::reader::CustomAttribute::TypeNamespaceAndName
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,CustomAttribute *this)

{
  undefined1 auVar1 [12];
  uint uVar2;
  coded_index<winmd::reader::CustomAttributeType> cVar3;
  coded_index<winmd::reader::MemberRefParent> cVar4;
  value_type vVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string local_50;
  row_base<winmd::reader::MethodDef> local_30;
  
  cVar3 = Type(this);
  if ((cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
       super_index_base<winmd::reader::CustomAttributeType>.m_value & 7) == 3) {
    cVar3 = Type(this);
    local_50._M_dataplus._M_p =
         (pointer)&(cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
                    super_index_base<winmd::reader::CustomAttributeType>.m_table)->m_database->
                   MemberRef;
    local_50._M_string_length._0_4_ =
         (cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
          super_index_base<winmd::reader::CustomAttributeType>.m_value >> 3) - 1;
    cVar4 = MemberRef::Class((MemberRef *)&local_50);
    uVar2 = cVar4.super_typed_index<winmd::reader::MemberRefParent>.
            super_index_base<winmd::reader::MemberRefParent>.m_value;
    if ((uVar2 & 7) == 1) {
      local_50._M_dataplus._M_p =
           (pointer)(cVar4.super_typed_index<winmd::reader::MemberRefParent>.
                     super_index_base<winmd::reader::MemberRefParent>.m_table)->m_database;
      local_50._M_string_length._0_4_ = (uVar2 >> 3) - 1;
      bVar6 = TypeRef::TypeNamespace((TypeRef *)&local_50);
      bVar7 = TypeRef::TypeName((TypeRef *)&local_50);
      goto LAB_0013e20e;
    }
    if (((undefined1  [16])
         cVar4.super_typed_index<winmd::reader::MemberRefParent>.
         super_index_base<winmd::reader::MemberRefParent> & (undefined1  [16])0x7) !=
        (undefined1  [16])0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "A CustomAttribute MemberRef should only be a TypeDef or TypeRef",
                 (allocator<char> *)&local_30);
      impl::throw_invalid(&local_50);
    }
    auVar1._8_4_ = (uVar2 >> 3) - 1;
    auVar1._0_8_ = &(cVar4.super_typed_index<winmd::reader::MemberRefParent>.
                     super_index_base<winmd::reader::MemberRefParent>.m_table)->m_database->TypeDef;
  }
  else {
    cVar3 = Type(this);
    local_30.m_table =
         &((cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
            super_index_base<winmd::reader::CustomAttributeType>.m_table)->m_database->MethodDef).
          super_table_base;
    local_30.m_index =
         (cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
          super_index_base<winmd::reader::CustomAttributeType>.m_value >> 3) - 1;
    vVar5 = row_base<winmd::reader::MethodDef>::get_parent_row<winmd::reader::TypeDef,5u>(&local_30)
    ;
    auVar1 = vVar5.super_row_base<winmd::reader::TypeDef>._0_12_;
  }
  local_50._M_dataplus._M_p = auVar1._0_8_;
  local_50._M_string_length._0_4_ = auVar1._8_4_;
  bVar6 = TypeDef::TypeNamespace((TypeDef *)&local_50);
  bVar7 = TypeDef::TypeName((TypeDef *)&local_50);
LAB_0013e20e:
  __return_storage_ptr__->first = bVar6;
  __return_storage_ptr__->second = bVar7;
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::TypeNamespaceAndName() const
    {
        if (Type().type() == CustomAttributeType::MemberRef)
        {
            auto const& member_parent = Type().MemberRef().Class();
            switch (member_parent.type())
            {
            case MemberRefParent::TypeDef:
            {
                auto const& def = member_parent.TypeDef();
                return std::pair{ def.TypeNamespace(), def.TypeName() };
            }

            case MemberRefParent::TypeRef:
            {
                auto const& ref = member_parent.TypeRef();
                return std::pair{ ref.TypeNamespace(), ref.TypeName() };
            }
            default:
                impl::throw_invalid("A CustomAttribute MemberRef should only be a TypeDef or TypeRef");
            }
        }
        else
        {
            auto const& def = Type().MethodDef().Parent();
            return std::pair{ def.TypeNamespace(), def.TypeName() };
        }
    }